

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmInstallUserFunction(jx9_vm *pVm,jx9_vm_func *pFunc,SyString *pName)

{
  SyHashEntry *pSVar1;
  jx9_vm_func *pLink;
  sxi32 rc;
  SyHashEntry *pEntry;
  SyString *pName_local;
  jx9_vm_func *pFunc_local;
  jx9_vm *pVm_local;
  
  pEntry = (SyHashEntry *)pName;
  if (pName == (SyString *)0x0) {
    pEntry = (SyHashEntry *)&pFunc->sName;
  }
  pSVar1 = SyHashGet(&pVm->hFunction,pEntry->pKey,pEntry->nKeyLen);
  if (pSVar1 == (SyHashEntry *)0x0) {
    pFunc->pNextName = (jx9_vm_func *)0x0;
    pVm_local._4_4_ = SyHashInsert(&pVm->hFunction,pEntry->pKey,pEntry->nKeyLen,pFunc);
  }
  else {
    if ((jx9_vm_func *)pSVar1->pUserData != pFunc) {
      pFunc->pNextName = (jx9_vm_func *)pSVar1->pUserData;
      pSVar1->pUserData = pFunc;
    }
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmInstallUserFunction(
	jx9_vm *pVm,        /* Target VM */
	jx9_vm_func *pFunc, /* Target function */
	SyString *pName     /* Function name */
	)
{
	SyHashEntry *pEntry;
	sxi32 rc;
	if( pName == 0 ){
		/* Use the built-in name */
		pName = &pFunc->sName;
	}
	/* Check for duplicates (functions with the same name) first */
	pEntry = SyHashGet(&pVm->hFunction, pName->zString, pName->nByte);
	if( pEntry ){
		jx9_vm_func *pLink = (jx9_vm_func *)pEntry->pUserData;
		if( pLink != pFunc ){
			/* Link */
			pFunc->pNextName = pLink;
			pEntry->pUserData = pFunc;
		}
		return SXRET_OK;
	}
	/* First time seen */
	pFunc->pNextName = 0;
	rc = SyHashInsert(&pVm->hFunction, pName->zString, pName->nByte, pFunc);
	return rc;
}